

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O2

int rtosc_subpath_pat_type(char *pattern)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  byte *pbVar8;
  
  pcVar5 = strrchr(pattern,0x2a);
  pcVar6 = strchr(pattern,0x23);
  bVar1 = *pattern;
  uVar7 = bVar1 - 0x2a;
  if (uVar7 == 0) {
    uVar7 = (uint)(byte)pattern[1];
  }
  if (uVar7 == 0) {
    iVar4 = 1;
  }
  else {
    bVar2 = true;
    pbVar8 = (byte *)(pattern + 1);
    while (bVar1 != 0) {
      bVar3 = false;
      if (((-1 < (char)bVar1) &&
          (((0x2f < bVar1 || ((0x800900000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
           (bVar1 != 0x7b)))) && (bVar3 = false, bVar1 != 0x7d)) {
        bVar3 = bVar2;
      }
      bVar2 = bVar3;
      bVar1 = *pbVar8;
      pbVar8 = pbVar8 + 1;
    }
    if ((bVar2) && (pcVar5 == (char *)0x0)) {
      iVar4 = 2;
    }
    else {
      iVar4 = (uint)(pcVar6 != (char *)0x0) * 5 + 2;
    }
  }
  return iVar4;
}

Assistant:

int rtosc_subpath_pat_type(const char *pattern)
{
    int charwise_only = 1;
    const char *last_star = strrchr(pattern, '*');
    const char *pound = strchr(pattern, '#');
    if(!strcmp("*", pattern))
        return RTOSC_MATCH_ALL;

    for(const char *p = pattern;*p;++p)
        charwise_only &= is_charwise(*p);
    if(charwise_only && !last_star)
        return RTOSC_MATCH_CHAR;
    if(pound)
        return RTOSC_MATCH_ENUMERATED;


    return 2;
}